

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QMetaCallEvent::allocArgs(QMetaCallEvent *this)

{
  long in_RDI;
  void *memory;
  size_t each;
  undefined8 local_28;
  
  if (*(int *)(in_RDI + 0x40) != 0) {
    if ((ulong)((long)*(int *)(in_RDI + 0x40) * 0x10) < 0x31) {
      local_28 = (void *)(in_RDI + 0x48);
    }
    else {
      local_28 = calloc((long)*(int *)(in_RDI + 0x40),0x10);
    }
    if (local_28 == (void *)0x0) {
      qBadAlloc();
    }
    *(void **)(in_RDI + 0x30) = local_28;
  }
  return;
}

Assistant:

inline void QMetaCallEvent::allocArgs()
{
    if (!d.nargs_)
        return;

    constexpr size_t each = sizeof(void*) + sizeof(QMetaType);
    void *const memory = d.nargs_ * each > sizeof(prealloc_) ?
        calloc(d.nargs_, each) : prealloc_;

    Q_CHECK_PTR(memory);
    d.args_ = static_cast<void **>(memory);
}